

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

int __thiscall
c4::basic_substring<const_char>::compare(basic_substring<const_char> *this,char *that,size_t sz)

{
  error_flags eVar1;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  bool bVar2;
  size_t i;
  size_t min;
  ulong local_88;
  bool local_7a;
  ulong local_50;
  int local_4;
  
  if (in_RSI == 0 && in_RDX != 0) {
    eVar1 = get_error_flags();
    if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    handle_error(0x34984b,(char *)0x14de,"check failed: %s","that || sz == 0");
  }
  bVar2 = true;
  if (*in_RDI == 0) {
    bVar2 = in_RDI[1] == 0;
  }
  if ((bool)(bVar2 ^ 1)) {
    eVar1 = get_error_flags();
    if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    handle_error(0x34984b,(char *)0x14df,"check failed: %s","str || len == 0");
  }
  local_7a = *in_RDI == 0 || in_RSI == 0;
  if (local_7a) {
    if (in_RDI[1] == in_RDX) {
      if (in_RDI[1] != 0 || in_RDX != 0) {
        eVar1 = get_error_flags();
        if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        handle_error(0x34984b,(char *)0x14f1,"check failed: %s","len == 0 && sz == 0");
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
      if ((ulong)in_RDI[1] < in_RDX) {
        local_4 = -1;
      }
    }
  }
  else {
    local_88 = in_RDX;
    if ((ulong)in_RDI[1] < in_RDX) {
      local_88 = in_RDI[1];
    }
    for (local_50 = 0; local_50 < local_88; local_50 = local_50 + 1) {
      if (*(char *)(*in_RDI + local_50) != *(char *)(in_RSI + local_50)) {
        if (*(char *)(in_RSI + local_50) <= *(char *)(*in_RDI + local_50)) {
          return 1;
        }
        return -1;
      }
    }
    if ((ulong)in_RDI[1] < in_RDX) {
      local_4 = -1;
    }
    else if (in_RDI[1] == in_RDX) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

C4_PURE int compare(const char *C4_RESTRICT that, size_t sz) const noexcept
    {
        C4_XASSERT(that || sz  == 0);
        C4_XASSERT(str  || len == 0);
        if(C4_LIKELY(str && that))
        {
            {
                const size_t min = len < sz ? len : sz;
                for(size_t i = 0; i < min; ++i)
                    if(str[i] != that[i])
                        return str[i] < that[i] ? -1 : 1;
            }
            if(len < sz)
                return -1;
            else if(len == sz)
                return 0;
            else
                return 1;
        }
        else if(len == sz)
        {
            C4_XASSERT(len == 0 && sz == 0);
            return 0;
        }
        return len < sz ? -1 : 1;
    }